

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall diy::FileStorage::~FileStorage(FileStorage *this)

{
  map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
  *this_00;
  pointer ppVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  const_iterator it;
  undefined7 in_stack_ffffffffffffff98;
  byte in_stack_ffffffffffffff9f;
  resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  local_48;
  _Self local_30;
  resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  local_28;
  _Self local_10 [2];
  
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_put_001e1f20;
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::const_access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
                  *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::operator->(&local_28);
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
       ::begin((map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::~resource_accessor
            ((resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
              *)0x118ca7);
  while( true ) {
    critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
    ::const_access((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
                    *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    this_00 = resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
              ::operator->(&local_48);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
         ::end((map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>
                *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffff9f = std::operator!=(local_10,&local_30);
    resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
    ::~resource_accessor
              ((resource_accessor<const_std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
                *)0x118cf9);
    if ((in_stack_ffffffffffffff9f & 1) == 0) break;
    ppVar1 = std::_Rb_tree_const_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_>
                         *)0x118d0d);
    io::utils::remove((char *)&(ppVar1->second).name);
    std::_Rb_tree_const_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_diy::FileStorage::FileRecord>_> *)
               this_00);
  }
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::~critical_resource
            ((critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
              *)0x118d3a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_RDI);
  return;
}

Assistant:

~FileStorage()
      {
        for (FileRecordMap::const_iterator it =  filenames_.const_access()->begin();
                                           it != filenames_.const_access()->end();
                                         ++it)
        {
          io::utils::remove(it->second.name);
        }
      }